

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

int Abc_NtkToSop(Abc_Ntk_t *pNtk,int fMode,int nCubeLimit)

{
  int iVar1;
  int nCubeLimit_local;
  int fMode_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x494,"int Abc_NtkToSop(Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkHasBlackbox(pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkHasSop(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkHasMapping(pNtk);
      if (iVar1 == 0) {
        iVar1 = Abc_NtkHasBdd(pNtk);
        if (iVar1 == 0) {
          iVar1 = Abc_NtkHasAig(pNtk);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                          ,0x4a9,"int Abc_NtkToSop(Abc_Ntk_t *, int, int)");
          }
          iVar1 = Abc_NtkAigToBdd(pNtk);
          if (iVar1 == 0) {
            pNtk_local._4_4_ = 0;
          }
          else {
            pNtk_local._4_4_ = Abc_NtkBddToSop(pNtk,fMode,nCubeLimit);
          }
        }
        else {
          pNtk_local._4_4_ = Abc_NtkBddToSop(pNtk,fMode,nCubeLimit);
        }
      }
      else {
        pNtk_local._4_4_ = Abc_NtkMapToSop(pNtk);
      }
    }
    else if (fMode == -1) {
      pNtk_local._4_4_ = 1;
    }
    else {
      iVar1 = Abc_NtkSopToBdd(pNtk);
      if (iVar1 == 0) {
        pNtk_local._4_4_ = 0;
      }
      else {
        pNtk_local._4_4_ = Abc_NtkBddToSop(pNtk,fMode,nCubeLimit);
      }
    }
  }
  else {
    pNtk_local._4_4_ = 1;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkToSop( Abc_Ntk_t * pNtk, int fMode, int nCubeLimit )
{
    assert( !Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkHasBlackbox(pNtk) )
        return 1;
    if ( Abc_NtkHasSop(pNtk) )
    {
        if ( fMode == -1 )
            return 1;
        if ( !Abc_NtkSopToBdd(pNtk) )
            return 0;
        return Abc_NtkBddToSop(pNtk, fMode, nCubeLimit);
    }
    if ( Abc_NtkHasMapping(pNtk) )
        return Abc_NtkMapToSop(pNtk);
    if ( Abc_NtkHasBdd(pNtk) )
        return Abc_NtkBddToSop(pNtk, fMode, nCubeLimit);
    if ( Abc_NtkHasAig(pNtk) )
    {
        if ( !Abc_NtkAigToBdd(pNtk) )
            return 0;
        return Abc_NtkBddToSop(pNtk, fMode, nCubeLimit);
    }
    assert( 0 );
    return 0;
}